

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dotdot.c
# Opt level: O3

char * Curl_dedotdotify(char *input)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  byte *pbVar6;
  byte *__s;
  char *pcVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *__dest;
  byte *pbVar10;
  int iVar11;
  char cVar12;
  uint uVar13;
  
  sVar5 = strlen(input);
  pbVar6 = (byte *)(*Curl_cmalloc)(sVar5 + 1);
  if (pbVar6 == (byte *)0x0) {
    pbVar9 = (byte *)0x0;
  }
  else {
    __s = (byte *)(*Curl_cstrdup)(input);
    if (__s == (byte *)0x0) {
      pbVar9 = (byte *)0x0;
      __s = pbVar6;
    }
    else {
      pcVar7 = strchr((char *)__s,0x3f);
      if (pcVar7 != (char *)0x0) {
        *pcVar7 = '\0';
      }
      bVar2 = *__s;
      pbVar9 = __s;
      __dest = pbVar6;
      do {
        uVar13 = (uint)bVar2;
        pbVar8 = pbVar9 + 2;
        while( true ) {
          cVar12 = (char)uVar13;
          iVar11 = 0x2e - uVar13;
          iVar3 = iVar11;
          pbVar9 = pbVar8;
          if (cVar12 == '.') {
            if (pbVar8[-1] == 0x2f) goto LAB_0012ce61;
            if (pbVar8[-1] - 0x2e == 0) {
              iVar3 = 0x2f - (uint)*pbVar8;
            }
            else {
              iVar3 = -(pbVar8[-1] - 0x2e);
            }
          }
          if (iVar3 == 0) {
            pbVar9 = pbVar8 + 1;
            goto LAB_0012ce61;
          }
          iVar3 = 0x2f - uVar13;
          if (cVar12 == '/') {
            if (pbVar8[-1] - 0x2e == 0) {
              iVar3 = 0x2f - (uint)*pbVar8;
            }
            else {
              iVar3 = -(pbVar8[-1] - 0x2e);
            }
            if (iVar3 == 0) goto LAB_0012ce61;
            uVar4 = pbVar8[-1] - 0x2e;
            if (uVar4 == 0) {
              uVar4 = (uint)*pbVar8;
            }
            iVar3 = -uVar4;
          }
          if (iVar3 != 0) break;
          pbVar8[-1] = 0x2f;
          pbVar8 = pbVar8 + 1;
          uVar13 = 0x2f;
        }
        pbVar9 = pbVar8 + -2;
        iVar3 = strncmp("/../",(char *)pbVar9,4);
        if (iVar3 == 0) {
          do {
            pbVar9 = pbVar8 + 1;
            if (__dest <= pbVar6) break;
            pbVar10 = __dest + -1;
            pbVar1 = __dest + -1;
            __dest = pbVar10;
          } while (*pbVar1 != 0x2f);
LAB_0012ce5b:
          *__dest = 0;
        }
        else {
          iVar3 = strcmp("/..",(char *)pbVar9);
          if (iVar3 == 0) {
            *pbVar8 = 0x2f;
            pbVar10 = __dest;
            do {
              __dest = pbVar10;
              pbVar9 = pbVar8;
              if (pbVar10 <= pbVar6) break;
              __dest = pbVar10 + -1;
              pbVar1 = pbVar10 + -1;
              pbVar10 = __dest;
            } while (*pbVar1 != 0x2f);
            goto LAB_0012ce5b;
          }
          if (cVar12 == '.') {
            if (pbVar8[-1] != 0) {
              uVar4 = pbVar8[-1] - 0x2e;
              if (uVar4 == 0) {
                uVar4 = (uint)*pbVar8;
              }
              iVar11 = -uVar4;
              goto LAB_0012cdfa;
            }
LAB_0012cecd:
            pbVar8[-2] = 0;
            break;
          }
LAB_0012cdfa:
          if (iVar11 == 0) goto LAB_0012cecd;
          do {
            *__dest = (byte)uVar13;
            __dest = __dest + 1;
            bVar2 = pbVar9[1];
            uVar13 = (uint)bVar2;
            pbVar9 = pbVar9 + 1;
            if (bVar2 == 0x2f) break;
          } while (bVar2 != 0);
          *__dest = 0;
        }
LAB_0012ce61:
        bVar2 = *pbVar9;
      } while (bVar2 != 0);
      pbVar9 = pbVar6;
      if (pcVar7 != (char *)0x0) {
        sVar5 = strlen(input + ((long)pcVar7 - (long)__s));
        memcpy(__dest,input + ((long)pcVar7 - (long)__s),sVar5 + 1);
      }
    }
    (*Curl_cfree)(__s);
  }
  return (char *)pbVar9;
}

Assistant:

char *Curl_dedotdotify(const char *input)
{
  size_t inlen = strlen(input);
  char *clone;
  size_t clen = inlen; /* the length of the cloned input */
  char *out = malloc(inlen+1);
  char *outptr;
  char *orgclone;
  char *queryp;
  if(!out)
    return NULL; /* out of memory */

  /* get a cloned copy of the input */
  clone = strdup(input);
  if(!clone) {
    free(out);
    return NULL;
  }
  orgclone = clone;
  outptr = out;

  /*
   * To handle query-parts properly, we must find it and remove it during the
   * dotdot-operation and then append it again at the end to the output
   * string.
   */
  queryp = strchr(clone, '?');
  if(queryp)
    *queryp = 0;

  do {

    /*  A.  If the input buffer begins with a prefix of "../" or "./", then
        remove that prefix from the input buffer; otherwise, */

    if(!strncmp("./", clone, 2)) {
      clone+=2;
      clen-=2;
    }
    else if(!strncmp("../", clone, 3)) {
      clone+=3;
      clen-=3;
    }

    /*  B.  if the input buffer begins with a prefix of "/./" or "/.", where
        "."  is a complete path segment, then replace that prefix with "/" in
        the input buffer; otherwise, */
    else if(!strncmp("/./", clone, 3)) {
      clone+=2;
      clen-=2;
    }
    else if(!strcmp("/.", clone)) {
      clone[1]='/';
      clone++;
      clen-=1;
    }

    /*  C.  if the input buffer begins with a prefix of "/../" or "/..", where
        ".." is a complete path segment, then replace that prefix with "/" in
        the input buffer and remove the last segment and its preceding "/" (if
        any) from the output buffer; otherwise, */

    else if(!strncmp("/../", clone, 4)) {
      clone+=3;
      clen-=3;
      /* remove the last segment from the output buffer */
      while(outptr > out) {
        outptr--;
        if(*outptr == '/')
          break;
      }
      *outptr = 0; /* zero-terminate where it stops */
    }
    else if(!strcmp("/..", clone)) {
      clone[2]='/';
      clone+=2;
      clen-=2;
      /* remove the last segment from the output buffer */
      while(outptr > out) {
        outptr--;
        if(*outptr == '/')
          break;
      }
      *outptr = 0; /* zero-terminate where it stops */
    }

    /*  D.  if the input buffer consists only of "." or "..", then remove
        that from the input buffer; otherwise, */

    else if(!strcmp(".", clone) || !strcmp("..", clone)) {
      *clone=0;
    }

    else {
      /*  E.  move the first path segment in the input buffer to the end of
          the output buffer, including the initial "/" character (if any) and
          any subsequent characters up to, but not including, the next "/"
          character or the end of the input buffer. */

      do {
        *outptr++ = *clone++;
        clen--;
      } while(*clone && (*clone != '/'));
      *outptr = 0;
    }

  } while(*clone);

  if(queryp) {
    size_t qlen;
    /* There was a query part, append that to the output. The 'clone' string
       may now have been altered so we copy from the original input string
       from the correct index. */
    size_t oindex = queryp - orgclone;
    qlen = strlen(&input[oindex]);
    memcpy(outptr, &input[oindex], qlen+1); /* include the ending zero byte */
  }

  free(orgclone);
  return out;
}